

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool __thiscall wasm::RemoveUnusedBrs::optimizeGC(RemoveUnusedBrs *this,Function *func)

{
  undefined8 func_00;
  bool bVar1;
  Module *pMVar2;
  ReFinalize local_250;
  undefined1 local_100 [8];
  Optimizer optimizer;
  Function *func_local;
  RemoveUnusedBrs *this_local;
  
  optimizer._216_8_ = func;
  pMVar2 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                       ).
                       super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       .
                       super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  if (bVar1) {
    optimizeGC::Optimizer::Optimizer((Optimizer *)local_100);
    pMVar2 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                         ).
                         super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         .
                         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       );
    Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::setModule
              ((Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_> *)local_100,pMVar2);
    Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>::doWalkFunction
              ((Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_> *)local_100,
               (Function *)optimizer._216_8_);
    this_local._7_1_ =
         ((byte)optimizer.super_PostWalker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.
                super_Walker<Optimizer,_wasm::Visitor<Optimizer,_void>_>.currModule & 1) != 0;
    if (this_local._7_1_) {
      ReFinalize::ReFinalize(&local_250);
      func_00 = optimizer._216_8_;
      pMVar2 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                           .
                           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         );
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_250.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 (Function *)func_00,pMVar2);
      ReFinalize::~ReFinalize(&local_250);
    }
    optimizeGC::Optimizer::~Optimizer((Optimizer *)local_100);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool optimizeGC(Function* func) {
    if (!getModule()->features.hasGC()) {
      return false;
    }

    struct Optimizer : public PostWalker<Optimizer> {
      bool worked = false;

      void visitBrOn(BrOn* curr) {
        // Ignore unreachable BrOns which we cannot improve anyhow. Note that
        // we must check the ref field manually, as we may be changing types as
        // we go here. (Another option would be to use a TypeUpdater here
        // instead of calling ReFinalize at the very end, but that would be more
        // complex and slower.)
        if (curr->type == Type::unreachable ||
            curr->ref->type == Type::unreachable) {
          return;
        }

        // First, check for a possible null which would prevent optimizations on
        // null checks.
        // TODO: Look into using BrOnNonNull here, to replace a br_on_func whose
        // input is (ref null func) with br_on_non_null (as only the null check
        // would be needed).
        // TODO: Use the fallthrough to determine in more cases that we
        // definitely have a null.
        auto refType = curr->ref->type;
        if (refType.isNullable() &&
            (curr->op == BrOnNull || curr->op == BrOnNonNull)) {
          return;
        }

        if (curr->op == BrOnNull) {
          assert(refType.isNonNullable());
          // This cannot be null, so the br is never taken, and the non-null
          // value flows through.
          replaceCurrent(curr->ref);
          worked = true;
          return;
        }
        if (curr->op == BrOnNonNull) {
          assert(refType.isNonNullable());
          // This cannot be null, so the br is always taken.
          replaceCurrent(
            Builder(*getModule()).makeBreak(curr->name, curr->ref));
          worked = true;
          return;
        }

        // Check if the type is the kind we are checking for.
        auto result = GCTypeUtils::evaluateCastCheck(refType, curr->castType);
        if (curr->op == BrOnCastFail) {
          result = GCTypeUtils::flipEvaluationResult(result);
        }

        if (result == GCTypeUtils::Success) {
          // The cast succeeds, so we can switch from BrOn to a simple br that
          // is always taken.
          replaceCurrent(
            Builder(*getModule()).makeBreak(curr->name, curr->ref));
          worked = true;
        } else if (result == GCTypeUtils::Failure) {
          // The cast fails, so the branch is never taken, and the value just
          // flows through.
          replaceCurrent(curr->ref);
          worked = true;
        }
        // TODO: Handle SuccessOnlyIfNull and SuccessOnlyIfNonNull.
      }
    } optimizer;

    optimizer.setModule(getModule());
    optimizer.doWalkFunction(func);

    // If we removed any BrOn instructions, that might affect the reachability
    // of the things they used to break to, so update types.
    if (optimizer.worked) {
      ReFinalize().walkFunctionInModule(func, getModule());
      return true;
    }
    return false;
  }